

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O1

int kvtree_sort_int(kvtree *hash,int direction)

{
  kvtree_elem_struct *pkVar1;
  int iVar2;
  kvtree_elem_struct *pkVar3;
  long lVar4;
  code *__compar;
  long lVar5;
  size_t __nmemb;
  uint uVar6;
  sort_elem_int *list;
  void *local_38;
  
  if ((hash == (kvtree *)0x0) || (pkVar3 = hash->lh_first, pkVar3 == (kvtree_elem_struct *)0x0)) {
    __nmemb = 0;
  }
  else {
    __nmemb = 0;
    do {
      pkVar3 = (pkVar3->pointers).le_next;
      __nmemb = __nmemb + 1;
    } while (pkVar3 != (kvtree_elem_struct *)0x0);
  }
  local_38 = kvtree_malloc(__nmemb << 4,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                           ,0x26b);
  uVar6 = 0;
  if (hash == (kvtree *)0x0) {
    pkVar3 = (kvtree_elem_struct *)0x0;
  }
  else {
    pkVar3 = hash->lh_first;
  }
  if (pkVar3 != (kvtree_elem_struct *)0x0) {
    lVar5 = 8;
    uVar6 = 0;
    do {
      iVar2 = atoi(pkVar3->key);
      *(int *)((long)local_38 + lVar5 + -8) = iVar2;
      *(kvtree_elem_struct **)((long)local_38 + lVar5) = pkVar3;
      pkVar3 = (pkVar3->pointers).le_next;
      lVar5 = lVar5 + 0x10;
      uVar6 = uVar6 + 1;
    } while (pkVar3 != (kvtree_elem_struct *)0x0);
  }
  __compar = kvtree_cmp_fn_int_asc;
  if (direction == 1) {
    __compar = kvtree_cmp_fn_int_desc;
  }
  qsort(local_38,__nmemb,0x10,__compar);
  if (0 < (int)uVar6) {
    lVar5 = (ulong)uVar6 + 1;
    lVar4 = (ulong)uVar6 * 0x10 + -8;
    do {
      pkVar3 = *(kvtree_elem_struct **)((long)local_38 + lVar4);
      pkVar1 = (pkVar3->pointers).le_next;
      if (pkVar1 != (kvtree_elem_struct *)0x0) {
        (pkVar1->pointers).le_prev = (pkVar3->pointers).le_prev;
      }
      *(pkVar3->pointers).le_prev = pkVar1;
      pkVar1 = hash->lh_first;
      (pkVar3->pointers).le_next = pkVar1;
      if (pkVar1 != (kvtree_elem_struct *)0x0) {
        (pkVar1->pointers).le_prev = &(pkVar3->pointers).le_next;
      }
      hash->lh_first = pkVar3;
      (pkVar3->pointers).le_prev = &hash->lh_first;
      lVar5 = lVar5 + -1;
      lVar4 = lVar4 + -0x10;
    } while (1 < lVar5);
  }
  kvtree_free(&local_38);
  return 0;
}

Assistant:

int kvtree_sort_int(kvtree* hash, int direction)
{
  /* get the size of the hash */
  int count = kvtree_size(hash);

  /* allocate space for each element */
  struct sort_elem_int* list = (struct sort_elem_int*) KVTREE_MALLOC(count * sizeof(struct sort_elem_int));

  /* walk the hash and fill in the keys */
  kvtree_elem* elem = NULL;
  int index = 0;
  for (elem = kvtree_elem_first(hash);
       elem != NULL;
       elem = kvtree_elem_next(elem))
  {
    int key = kvtree_elem_key_int(elem);
    list[index].key = key;
    list[index].addr = elem;
    index++;
  }

  /* sort the elements by key */
  int (*fn)(const void* a, const void* b) = NULL;
  fn = &kvtree_cmp_fn_int_asc;
  if (direction == KVTREE_SORT_DESCENDING) {
    fn = &kvtree_cmp_fn_int_desc;
  }
  qsort(list, count, sizeof(struct sort_elem_int), fn);

  /* walk the sorted list backwards, extracting the element by address,
   * and inserting at the head */
  while (index > 0) {
    index--;
    elem = list[index].addr;
    LIST_REMOVE(elem, pointers);
    LIST_INSERT_HEAD(hash, elem, pointers);
  }

  /* free the list */
  kvtree_free(&list);

  return KVTREE_SUCCESS;
}